

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_field_info.h
# Opt level: O2

iterator_range<google::protobuf::internal::RepeatedPtrIterator<google::protobuf::Message>_>
__thiscall
google::protobuf::internal::
RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>::Mutable
          (RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>
           *this)

{
  RepeatedPtrFieldBase *this_00;
  iterator iVar1;
  iterator_range<google::protobuf::internal::RepeatedPtrIterator<google::protobuf::Message>_> iVar2;
  
  this_00 = &Reflection::MutableRepeatedPtrFieldInternal<google::protobuf::Message>
                       (this->reflection,this->message,this->field)->super_RepeatedPtrFieldBase;
  iVar2.begin_iterator_.it_ = RepeatedPtrFieldBase::elements(this_00);
  iVar1 = RepeatedPtrField<google::protobuf::Message>::end
                    ((RepeatedPtrField<google::protobuf::Message> *)this_00);
  iVar2.end_iterator_.it_ = iVar1.it_;
  return iVar2;
}

Assistant:

iterator_range<typename RepeatedPtrField<FieldT>::iterator> Mutable() {
    auto& rep =
        *reflection->MutableRepeatedPtrFieldInternal<FieldT>(&message, field);
    return {rep.begin(), rep.end()};
  }